

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O2

void check_function<arg_res_tuple<long_double,3ul>,long_double>
               (arg_res_tuple<long_double,_3UL> *x_yref,longdouble y)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  StringRef local_2b8 [2];
  SourceLineInfo local_298;
  AssertionHandler catchAssertionHandler;
  tuple<long_double,_long_double> y_min_max;
  StringRef local_208;
  SourceLineInfo local_1f8;
  ScopedMessage scopedMessage0;
  stringstream stream;
  long local_188;
  undefined8 local_180 [46];
  
  bounds<long_double>(&y_min_max,x_yref->y);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0x13;
  poVar1 = std::operator<<((ostream *)&local_188,"args: ");
  pbVar2 = operator<<(poVar1,&x_yref->x);
  poVar1 = std::operator<<(pbVar2,"\n");
  std::operator<<(poVar1,"lower bound: ");
  poVar1 = std::ostream::_M_insert<long_double>
                     (y_min_max.super__Tuple_impl<0UL,_long_double,_long_double>.
                      super__Head_base<0UL,_long_double,_false>._M_head_impl);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"upper bound: ");
  poVar1 = std::ostream::_M_insert<long_double>
                     (y_min_max.super__Tuple_impl<0UL,_long_double,_long_double>.
                      super__Tuple_impl<1UL,_long_double>.super__Head_base<1UL,_long_double,_false>.
                      _M_head_impl);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"actual     : ");
  std::ostream::_M_insert<long_double>(y);
  local_298.file = "INFO";
  local_298.line = 4;
  local_1f8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
  ;
  local_1f8.line = 0x79;
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&catchAssertionHandler,(StringRef *)&local_298,&local_1f8,Info);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,(string *)local_2b8
                 );
  Catch::ScopedMessage::ScopedMessage(&scopedMessage0,(MessageBuilder *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)local_2b8);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
  local_2b8[0].m_start = "REQUIRE";
  local_2b8[0].m_size = 7;
  local_298.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
  ;
  local_298.line = 0x7a;
  Catch::StringRef::StringRef(&local_208,"(y_min <= y and y <= y_max)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,local_2b8,&local_298,local_208,Normal);
  local_2b8[0].m_start =
       (char *)CONCAT71(local_2b8[0].m_start._1_7_,
                        y <= y_min_max.super__Tuple_impl<0UL,_long_double,_long_double>.
                             super__Tuple_impl<1UL,_long_double>.
                             super__Head_base<1UL,_long_double,_false>._M_head_impl &&
                        y_min_max.super__Tuple_impl<0UL,_long_double,_long_double>.
                        super__Head_base<0UL,_long_double,_false>._M_head_impl <= y);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)local_2b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void check_function(const T_ref &x_yref, const T y) {
  const T y_ref{x_yref.y};
  const std::tuple<T, T> y_min_max{bounds(y_ref)};
  const T y_min{std::get<0>(y_min_max)};
  const T y_max{std::get<1>(y_min_max)};
  std::stringstream stream;
  stream << std::setprecision(std::numeric_limits<T>::digits10 + 1)
         << "args: " << x_yref.x << "\n"
         << "lower bound: " << y_min << "\n"
         << "upper bound: " << y_max << "\n"
         << "actual     : " << y;
  INFO(stream.str());
  REQUIRE((y_min <= y and y <= y_max));
}